

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  long lVar2;
  string stdOut;
  string local_60;
  string local_40;
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"rcc","");
  bVar1 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_40,false,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((bVar1) && ((this->QtVersion).Major - 5 < 2)) {
    lVar2 = std::__cxx11::string::find((char *)&local_60,0x49abb6,0);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char *)&local_60,0x49abb7,0);
      if (lVar2 != -1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(this->Rcc).ListOptions,(char (*) [6])0x49abb7);
      }
    }
    else {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->Rcc).ListOptions,(char (*) [7])"--list");
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    std::string stdOut;
    if (!this->GetQtExecutable(this->Rcc, "rcc", false, &stdOut)) {
      return false;
    }
    // Evaluate test output
    if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
      if (stdOut.find("--list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("--list");
      } else if (stdOut.find("-list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("-list");
      }
    }
  }

  return true;
}